

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void * nk_font_atlas_bake(nk_font_atlas *atlas,int *width,int *height,nk_font_atlas_format fmt)

{
  long *plVar1;
  nk_vec2 *pnVar2;
  byte bVar3;
  char cVar4;
  byte bVar5;
  short sVar6;
  short sVar7;
  nk_byte *data;
  nk_rune *pnVar8;
  uchar *puVar9;
  nk_handle nVar10;
  nk_baked_font *pnVar11;
  nk_vec2 nVar12;
  bool bVar13;
  nk_tt__edge *pnVar14;
  nk_handle nVar15;
  nk_rune nVar16;
  nk_handle nVar17;
  nk_handle nVar18;
  int iVar19;
  nk_uint nVar20;
  nk_uint nVar21;
  nk_uint nVar22;
  nk_uint nVar23;
  nk_uint nVar24;
  nk_uint nVar25;
  int iVar26;
  nk_tt__active_edge *z;
  nk_font *pnVar27;
  long lVar28;
  nk_font_glyph *pnVar29;
  nk_font_config *pnVar30;
  uint *puVar31;
  void *pvVar32;
  void *pvVar33;
  nk_tt__point *points;
  ulong uVar34;
  nk_tt__edge *p_00;
  nk_rp_rect *pnVar35;
  nk_tt__active_edge *pnVar36;
  nk_rp_rect *pnVar37;
  undefined8 *puVar38;
  nk_tt__active_edge *pnVar39;
  nk_tt__active_edge *pnVar40;
  nk_vec2 *pnVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  uint uVar45;
  ulong uVar46;
  float *pfVar47;
  nk_font_config *pnVar48;
  nk_tt__active_edge *pnVar49;
  nk_rune nVar50;
  nk_handle *pnVar51;
  void *pvVar52;
  char *tag;
  char *tag_00;
  char *tag_01;
  char *tag_02;
  char *tag_03;
  char *tag_04;
  char *tag_05;
  char *tag_06;
  char *extraout_RDX;
  char *pcVar53;
  long lVar54;
  nk_size nVar55;
  ushort uVar56;
  uint uVar57;
  int iVar58;
  uint uVar59;
  undefined1 uVar60;
  undefined8 *puVar61;
  ulong uVar62;
  ulong uVar63;
  nk_rune nVar64;
  nk_handle *alloc;
  int *piVar65;
  byte *pbVar66;
  long lVar67;
  int iVar68;
  byte *pbVar69;
  uint uVar70;
  int iVar71;
  void *p;
  nk_tt_fontinfo *pnVar72;
  ulong uVar73;
  ushort *puVar74;
  int iVar75;
  short *psVar76;
  uchar *puVar77;
  long lVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  float fVar81;
  float fVar82;
  undefined4 uVar83;
  float fVar84;
  float fVar85;
  float in_XMM3_Da;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float ya;
  int y0;
  nk_font_config *cfg;
  int ix0;
  int x1;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  int local_4bc;
  nk_tt__active_edge local_460;
  nk_font_config *local_440;
  undefined8 *local_438;
  nk_handle *local_430;
  undefined8 local_428;
  int local_41c;
  ulong local_418;
  int *local_410;
  uchar *local_408;
  nk_tt__edge *local_400;
  float local_3f4;
  float local_3f0;
  int local_3ec;
  ulong local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined1 local_3c8 [16];
  nk_tt_fontinfo *local_3b8;
  nk_tt__point *local_3b0;
  nk_handle *local_3a8;
  int local_3a0;
  nk_font_atlas_format local_39c;
  undefined4 local_398;
  int local_394;
  float local_390;
  float local_38c;
  int local_388;
  uint local_384;
  uint local_380;
  int local_37c;
  int local_378;
  int local_374;
  void *local_370;
  long local_368;
  size_t local_360;
  size_t local_358;
  ulong local_350;
  long local_348;
  nk_handle local_340;
  nk_handle local_338;
  nk_rp_coord *local_330;
  long local_328;
  nk_handle *local_320;
  nk_font_config *local_318;
  ulong local_310;
  long local_308;
  long local_300;
  nk_handle local_2f8;
  uchar *local_2f0;
  nk_font_glyph *local_2e8;
  long local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  int *local_2c8;
  size_t local_2c0;
  nk_rp_rect *local_2b8;
  size_t local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  short *local_298;
  long local_290;
  long local_288;
  nk_rp_rect *local_280;
  nk_rp_rect *local_278;
  ulong local_270;
  long local_268;
  long local_260;
  long local_258;
  ulong local_250;
  ulong local_248;
  int local_240;
  int local_23c;
  nk_rp_rect local_238 [32];
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b1f,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b20,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b21,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->permanent).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b22,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b23,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if (width == (int *)0x0) {
    __assert_fail("width",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b25,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if (height == (int *)0x0) {
    __assert_fail("height",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b26,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  local_39c = fmt;
  if (atlas->font_num == 0) {
    pnVar27 = nk_font_atlas_add_default(atlas,13.0,(nk_font_config *)0x0);
    atlas->default_font = pnVar27;
  }
  iVar71 = atlas->font_num;
  if ((long)iVar71 == 0) {
    __assert_fail("atlas->font_num",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b31,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  pnVar48 = atlas->config;
  if (pnVar48 == (nk_font_config *)0x0) {
    __assert_fail("config_list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2716,
                  "void nk_font_baker_memory(nk_size *, int *, struct nk_font_config *, int)");
  }
  atlas->glyph_count = 0;
  if (pnVar48->range == (nk_rune *)0x0) {
    pnVar48->range = nk_font_default_glyph_ranges::ranges;
  }
  iVar58 = 0;
  do {
    iVar19 = nk_range_count(pnVar48->range);
    iVar58 = iVar58 + iVar19;
    iVar19 = nk_range_glyph_count(pnVar48->range,iVar19);
    lVar28 = (long)iVar19 + (long)atlas->glyph_count;
    atlas->glyph_count = (int)lVar28;
    pnVar48 = pnVar48->next;
  } while (pnVar48 != (nk_font_config *)0x0);
  local_370 = (*(atlas->temporary).alloc)
                        ((atlas->temporary).userdata,(void *)0x0,
                         lVar28 * 0x2c + (long)iVar58 * 0x28 + (long)iVar71 * 0x48 + 0x88);
  if (local_370 == (void *)0x0) {
    __assert_fail("tmp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b37,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  iVar71 = atlas->glyph_count;
  iVar58 = atlas->font_num;
  alloc = (nk_handle *)((long)local_370 + 7U & 0xfffffffffffffff8);
  pnVar51 = alloc + 0xd;
  alloc[9].ptr = pnVar51;
  alloc[10].ptr = pnVar51 + (long)iVar58 * 9;
  pvVar52 = (void *)((long)iVar71 * 0x1c + (long)(pnVar51 + (long)iVar58 * 9));
  alloc[0xb].ptr = pvVar52;
  alloc[0xc].ptr = (void *)((long)pvVar52 + (long)iVar71 * 0x10 + 7 & 0xfffffffffffffff8);
  nVar10 = (nk_handle)(atlas->temporary).alloc;
  *alloc = (atlas->temporary).userdata;
  alloc[1] = nVar10;
  alloc[2] = (nk_handle)(atlas->temporary).free;
  pnVar29 = (nk_font_glyph *)
            (*(atlas->permanent).alloc)
                      ((atlas->permanent).userdata,(void *)0x0,(long)atlas->glyph_count * 0x30);
  atlas->glyphs = pnVar29;
  if (pnVar29 == (nk_font_glyph *)0x0) {
    __assert_fail("atlas->glyphs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b3e,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  (atlas->custom).w = 0xb5;
  (atlas->custom).h = 0x1c;
  pnVar48 = atlas->config;
  if (pnVar48 == (nk_font_config *)0x0) {
    __assert_fail("config_list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x274f,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  local_418 = (ulong)(uint)atlas->font_num;
  if (local_418 == 0) {
    __assert_fail("count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2750,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  iVar71 = 0;
  uVar59 = 0;
  pnVar30 = pnVar48;
  local_3a8 = &(atlas->temporary).userdata;
  do {
    iVar58 = nk_range_count(pnVar30->range);
    uVar59 = uVar59 + iVar58;
    iVar58 = nk_range_glyph_count(pnVar30->range,iVar58);
    iVar71 = iVar71 + iVar58;
    pnVar30 = pnVar30->next;
  } while (pnVar30 != (nk_font_config *)0x0);
  local_438 = (undefined8 *)CONCAT44(local_438._4_4_,iVar71);
  pvVar52 = alloc[9].ptr;
  pnVar30 = pnVar48;
  tag = (char *)0x0;
  do {
    data = (nk_byte *)pnVar30->ttf_blob;
    *(nk_byte **)((long)pvVar52 + (long)tag * 0x48) = data;
    *(undefined4 *)((long)pvVar52 + (long)tag * 0x48 + 8) = 0;
    nVar20 = nk_tt__find_table(data,0x15b39c,tag);
    nVar21 = nk_tt__find_table(data,0x15b3a1,tag_00);
    local_460.fx = (float)nVar21;
    *(nk_uint *)((long)pvVar52 + (long)tag * 0x48 + 0x10) = nVar21;
    nVar21 = nk_tt__find_table(data,0x15b3a6,tag_01);
    *(nk_uint *)((long)pvVar52 + (long)tag * 0x48 + 0x14) = nVar21;
    nVar22 = nk_tt__find_table(data,0x15b3ab,tag_02);
    *(nk_uint *)((long)pvVar52 + (long)tag * 0x48 + 0x18) = nVar22;
    nVar23 = nk_tt__find_table(data,0x15b3b0,tag_03);
    *(nk_uint *)((long)pvVar52 + (long)tag * 0x48 + 0x1c) = nVar23;
    nVar24 = nk_tt__find_table(data,0x15b3b5,tag_04);
    *(nk_uint *)((long)pvVar52 + (long)tag * 0x48 + 0x20) = nVar24;
    nVar25 = nk_tt__find_table(data,0x15b3ba,tag_05);
    *(nk_uint *)((long)pvVar52 + (long)tag * 0x48 + 0x24) = nVar25;
    if ((((nVar20 == 0) || (local_460.fx == 0.0)) || (nVar21 == 0)) ||
       (((nVar22 == 0 || (nVar23 == 0)) || (bVar13 = true, nVar24 == 0)))) {
      bVar13 = true;
      pcVar53 = tag_06;
      goto LAB_00121e44;
    }
    nVar22 = nk_tt__find_table(data,0x15b3bf,tag_06);
    if (nVar22 == 0) {
      uVar45 = 0xffff;
    }
    else {
      uVar45 = (uint)(ushort)(*(ushort *)(data + (ulong)nVar22 + 4) << 8 |
                             *(ushort *)(data + (ulong)nVar22 + 4) >> 8);
    }
    *(uint *)((long)pvVar52 + (long)tag * 0x48 + 0xc) = uVar45;
    uVar42 = *(ushort *)(data + (ulong)nVar20 + 2) << 8 | *(ushort *)(data + (ulong)nVar20 + 2) >> 8
    ;
    *(undefined4 *)((long)pvVar52 + (long)tag * 0x48 + 0x28) = 0;
    pcVar53 = extraout_RDX;
    if (uVar42 != 0) {
      uVar45 = nVar20 + 4;
      pcVar53 = (char *)(ulong)uVar42;
      do {
        uVar42 = *(ushort *)(data + uVar45) << 8 | *(ushort *)(data + uVar45) >> 8;
        if ((uVar42 == 0) ||
           ((uVar42 == 3 &&
            ((uVar42 = *(ushort *)(data + (ulong)uVar45 + 2) << 8 |
                       *(ushort *)(data + (ulong)uVar45 + 2) >> 8, uVar42 == 10 || (uVar42 == 1)))))
           ) {
          uVar70 = *(uint *)(data + (ulong)uVar45 + 4);
          *(uint *)((long)pvVar52 + (long)tag * 0x48 + 0x28) =
               (uVar70 >> 0x18 | (uVar70 & 0xff0000) >> 8 | (uVar70 & 0xff00) << 8 | uVar70 << 0x18)
               + nVar20;
        }
        uVar45 = uVar45 + 8;
        pcVar53 = pcVar53 + -1;
      } while (pcVar53 != (char *)0x0);
    }
    if (*(int *)((long)pvVar52 + (long)tag * 0x48 + 0x28) == 0) goto LAB_00121e44;
    *(uint *)((long)pvVar52 + (long)tag * 0x48 + 0x2c) =
         (uint)(ushort)(*(ushort *)(data + (long)(int)nVar21 + 0x32) << 8 |
                       *(ushort *)(data + (long)(int)nVar21 + 0x32) >> 8);
    pnVar30 = pnVar30->next;
    tag = tag + 1;
  } while (pnVar30 != (nk_font_config *)0x0);
  *height = 0;
  uVar45 = (uint)(1000 < (int)local_438) * 0x200;
  iVar71 = uVar45 + 0x200;
  *width = iVar71;
  uVar70 = uVar45 | 0x1ff;
  puVar31 = (uint *)(*(atlas->temporary).alloc)((atlas->temporary).userdata,(void *)0x0,0x48);
  pvVar52 = (*(atlas->temporary).alloc)
                      ((atlas->temporary).userdata,(void *)0x0,(ulong)(uVar70 << 4));
  if ((puVar31 == (uint *)0x0) || (pvVar52 == (void *)0x0)) {
    if (puVar31 != (uint *)0x0) {
      (*(atlas->temporary).free)((atlas->temporary).userdata,puVar31);
    }
    if (pvVar52 != (void *)0x0) {
      (*(atlas->temporary).free)((atlas->temporary).userdata,pvVar52);
    }
  }
  else {
    alloc[4].id = iVar71;
    *(undefined4 *)((long)alloc + 0x24) = 0x8000;
    alloc[7].ptr = (void *)0x0;
    alloc[3].ptr = puVar31;
    alloc[8].ptr = pvVar52;
    *(undefined4 *)((long)alloc + 0x2c) = 1;
    alloc[5].id = iVar71;
    alloc[6].ptr = (void *)0x100000001;
    uVar46 = (ulong)(uVar45 + 0x1fe);
    pvVar33 = pvVar52;
    do {
      pvVar32 = pvVar33;
      *(void **)((long)pvVar32 + 8) = (void *)((long)pvVar32 + 0x10);
      uVar46 = uVar46 - 1;
      pvVar33 = (void *)((long)pvVar32 + 0x10);
    } while (uVar46 != 0);
    *(undefined8 *)((long)pvVar32 + 0x18) = 0;
    puVar31[3] = 1;
    puVar31[4] = 0;
    *(void **)(puVar31 + 8) = pvVar52;
    *(uint **)(puVar31 + 6) = puVar31 + 10;
    *puVar31 = uVar70;
    puVar31[1] = 0x7fff;
    puVar31[5] = uVar70;
    puVar31[2] = (uVar45 + 0x1fe + uVar70) / uVar70;
    puVar31[10] = 0;
    *(uint **)(puVar31 + 0xc) = puVar31 + 0xe;
    *(short *)(puVar31 + 0xe) = (short)uVar70;
    *(undefined2 *)((long)puVar31 + 0x3a) = 0xffff;
    puVar31[0x10] = 0;
    puVar31[0x11] = 0;
  }
  local_238[0].x = 0;
  local_238[0].y = 0;
  local_238[0].was_packed = 0;
  local_238[0]._0_8_ = (ulong)CONCAT22((atlas->custom).h + 1,(atlas->custom).w * 2 + 1) << 0x20;
  alloc[6].ptr = (void *)0x100000001;
  nk_rp_pack_rects((nk_rp_context *)alloc[3].ptr,local_238,1);
  iVar71 = (uint)local_238[0].h + (uint)local_238[0].y;
  if ((int)((uint)local_238[0].h + (uint)local_238[0].y) < *height) {
    iVar71 = *height;
  }
  *height = iVar71;
  (atlas->custom).x = local_238[0].x;
  (atlas->custom).y = local_238[0].y;
  (atlas->custom).w = local_238[0].w;
  (atlas->custom).h = local_238[0].h;
  if ((int)(uint)local_418 < 1) {
    uVar45 = 0;
    local_4bc = 0;
    iVar71 = 0;
  }
  else {
    local_430 = alloc + 3;
    local_428 = 0;
    iVar71 = 0;
    local_4bc = 0;
    uVar46 = 0;
    do {
      pnVar8 = pnVar48->range;
      nVar50 = *pnVar8;
      local_410 = (int *)0x0;
      local_3d8 = 0;
      if (nVar50 != 0) {
        local_410 = (int *)0x0;
        local_3d8 = 0;
        do {
          if (pnVar8[(long)local_410 * 2 + 1] == 0) break;
          local_3d8 = (ulong)(((int)local_3d8 - nVar50) + pnVar8[(long)local_410 * 2 + 1] + 1);
          nVar50 = pnVar8[(long)local_410 * 2 + 2];
          local_410 = (int *)((long)local_410 + 1);
        } while (nVar50 != 0);
      }
      pnVar72 = (nk_tt_fontinfo *)(local_428 * 0x48 + (long)alloc[9].ptr);
      local_400 = (nk_tt__edge *)CONCAT44(local_400._4_4_,(int)uVar46);
      pfVar47 = (float *)(uVar46 * 0x28 + (long)alloc[0xc].ptr);
      *(float **)&pnVar72[1].fontstart = pfVar47;
      pnVar72[1].loca = (int)local_410;
      if ((int)local_410 != 0) {
        fVar86 = pnVar48->size;
        pvVar52 = alloc[10].ptr;
        uVar46 = 0;
        do {
          *pfVar47 = fVar86;
          pfVar47[1] = (float)pnVar8[uVar46 * 2];
          nVar50 = pnVar8[uVar46 * 2 + 1];
          nVar64 = pnVar8[uVar46 * 2];
          pfVar47[4] = (float)((nVar50 - nVar64) + 1);
          *(void **)(pfVar47 + 6) = (void *)((long)iVar71 * 0x1c + (long)pvVar52);
          iVar71 = (nVar50 - nVar64) + iVar71 + 1;
          uVar46 = uVar46 + 1;
          pfVar47 = pfVar47 + 10;
        } while (((ulong)local_410 & 0xffffffff) != uVar46);
      }
      pnVar72[1].data = (uchar *)((long)local_4bc * 0x10 + (long)alloc[0xb].ptr);
      nk_tt_PackSetOversampling
                ((nk_tt_pack_context *)local_430,(uint)pnVar48->oversample_h,
                 (uint)pnVar48->oversample_v);
      iVar58 = pnVar72[1].loca;
      if ((long)iVar58 < 1) {
        uVar45 = 0;
      }
      else {
        puVar77 = pnVar72[1].data;
        lVar28._0_4_ = pnVar72[1].fontstart;
        lVar28._4_4_ = pnVar72[1].numGlyphs;
        lVar67 = 0;
        uVar45 = 0;
        local_3c8._0_8_ = lVar28;
        do {
          fVar86 = *(float *)(lVar28 + lVar67 * 0x28);
          uVar83 = 0;
          fVar84 = 0.0;
          fVar85 = 0.0;
          if (fVar86 <= 0.0) {
            uVar83 = 0x80000000;
            fVar84 = -0.0;
            fVar85 = -0.0;
            fVar86 = -fVar86;
            uVar70 = (uint)(ushort)(*(ushort *)(pnVar72->data + (long)pnVar72->head + 0x12) << 8 |
                                   *(ushort *)(pnVar72->data + (long)pnVar72->head + 0x12) >> 8);
          }
          else {
            puVar9 = pnVar72->data;
            lVar54 = (long)pnVar72->hhea;
            uVar70 = ((int)(short)((ushort)puVar9[lVar54 + 4] << 8) | (uint)puVar9[lVar54 + 5]) -
                     ((int)(short)((ushort)puVar9[lVar54 + 6] << 8) | (uint)puVar9[lVar54 + 7]);
          }
          lVar54 = lVar28 + lVar67 * 0x28;
          *(undefined1 *)(lVar54 + 0x20) = *(undefined1 *)(alloc + 6);
          *(undefined1 *)(lVar54 + 0x21) = *(undefined1 *)((long)alloc + 0x34);
          if (0 < *(int *)(lVar54 + 0x10)) {
            local_460.fdx = (float)uVar83;
            local_460.fx = fVar86 / (float)(int)uVar70;
            psVar76 = (short *)(puVar77 + (long)(int)uVar45 * 0x10 + 6);
            lVar28 = 0;
            local_460.fdy = fVar84;
            local_460.direction = fVar85;
            do {
              if (*(int *)(lVar54 + 4) == 0) {
                iVar19 = *(int *)(*(long *)(lVar54 + 8) + lVar28 * 4);
              }
              else {
                iVar19 = *(int *)(lVar54 + 4) + (int)lVar28;
              }
              iVar19 = nk_tt_FindGlyphIndex(pnVar72,iVar19);
              uVar70 = alloc[6].id;
              uVar57 = *(uint *)((long)alloc + 0x34);
              nk_tt_GetGlyphBitmapBoxSubpixel
                        (pnVar72,iVar19,(float)uVar70 * local_460.fx,(float)uVar57 * local_460.fx,
                         local_460.fx,in_XMM3_Da,&local_238[0].id,(int *)&local_460,
                         (int *)&local_3e0,&local_41c);
              sVar6 = (short)*(undefined4 *)((long)alloc + 0x2c);
              psVar76[-1] = (((short)(int)local_3e0 + (short)uVar70) - (short)local_238[0]._0_8_) +
                            sVar6 + -1;
              *psVar76 = ~(ushort)local_460.next + sVar6 + (short)uVar57 + (short)local_41c;
              lVar28 = lVar28 + 1;
              psVar76 = psVar76 + 8;
            } while (lVar28 < *(int *)(lVar54 + 0x10));
            uVar45 = uVar45 + (int)lVar28;
            lVar28 = local_3c8._0_8_;
          }
          lVar67 = lVar67 + 1;
        } while (lVar67 != iVar58);
      }
      nk_rp_pack_rects((nk_rp_context *)local_430->ptr,(nk_rp_rect *)pnVar72[1].data,uVar45);
      if (0 < (int)uVar45) {
        puVar77 = pnVar72[1].data;
        lVar28 = 0;
        do {
          if (*(int *)(puVar77 + lVar28 + 0xc) != 0) {
            iVar58 = (uint)*(ushort *)(puVar77 + lVar28 + 6) +
                     (uint)*(ushort *)(puVar77 + lVar28 + 10);
            if ((int)((uint)*(ushort *)(puVar77 + lVar28 + 6) +
                     (uint)*(ushort *)(puVar77 + lVar28 + 10)) < *height) {
              iVar58 = *height;
            }
            *height = iVar58;
          }
          lVar28 = lVar28 + 0x10;
        } while ((ulong)uVar45 << 4 != lVar28);
      }
      uVar45 = (int)local_400 + (int)local_410;
      uVar46 = (ulong)uVar45;
      local_4bc = local_4bc + (int)local_3d8;
      local_428 = local_428 + 1;
    } while ((local_428 < local_418) && (pnVar48 = pnVar48->next, pnVar48 != (nk_font_config *)0x0))
    ;
  }
  if (local_4bc != (int)local_438) {
    __assert_fail("rect_n == total_glyph_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x27a7,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  if (iVar71 != (int)local_438) {
    __assert_fail("char_n == total_glyph_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x27a8,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  if (uVar45 != uVar59) {
    __assert_fail("range_n == total_range_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x27a9,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  uVar59 = *height - 1U >> 1 | *height - 1U;
  uVar59 = uVar59 >> 2 | uVar59;
  uVar59 = uVar59 >> 4 | uVar59;
  uVar59 = uVar59 >> 8 | uVar59;
  iVar71 = (uVar59 >> 0x10 | uVar59) + 1;
  *height = iVar71;
  pcVar53 = (char *)((long)iVar71 * (long)*width);
  bVar13 = false;
LAB_00121e44:
  if (bVar13) {
    (*(atlas->temporary).free)(*local_3a8,local_370);
    if (atlas->glyphs != (nk_font_glyph *)0x0) {
      (*(atlas->permanent).free)((atlas->permanent).userdata,atlas->glyphs);
      atlas->glyphs = (nk_font_glyph *)0x0;
    }
    if (atlas->pixel != (void *)0x0) {
      (*(atlas->temporary).free)((atlas->temporary).userdata,atlas->pixel);
      atlas->pixel = (void *)0x0;
    }
    pvVar52 = (void *)0x0;
  }
  else {
    pvVar52 = (*(atlas->temporary).alloc)(*local_3a8,(void *)0x0,(nk_size)pcVar53);
    atlas->pixel = pvVar52;
    if (pvVar52 == (void *)0x0) {
      __assert_fail("atlas->pixel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x2b4b,
                    "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                   );
    }
    lVar28 = (long)*width;
    if (lVar28 == 0) {
      __assert_fail("width",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x27ba,
                    "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                   );
    }
    iVar71 = *height;
    if (iVar71 == 0) {
      __assert_fail("height",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x27bb,
                    "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                   );
    }
    local_440 = atlas->config;
    if (local_440 == (nk_font_config *)0x0) {
      __assert_fail("config_list",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x27bc,
                    "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                   );
    }
    if (alloc == (nk_handle *)0x0) {
      __assert_fail("baker",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x27bd,
                    "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                   );
    }
    local_3e8 = (ulong)(uint)atlas->font_num;
    if (local_3e8 == 0) {
      __assert_fail("font_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x27be,
                    "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                   );
    }
    if (atlas->glyph_count == 0) {
      __assert_fail("glyphs_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x27bf,
                    "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                   );
    }
    local_2e8 = atlas->glyphs;
    if (local_2e8 != (nk_font_glyph *)0x0) {
      nk_zero(pvVar52,iVar71 * lVar28);
      alloc[7].ptr = pvVar52;
      *(int *)((long)alloc + 0x24) = iVar71;
      if ((int)local_3e8 < 1) {
        (*(code *)alloc[2])(*alloc,alloc[8].ptr);
        (*(code *)alloc[2])(*alloc,alloc[3].ptr);
      }
      else {
        local_320 = alloc + 3;
        local_258 = 0;
        local_358 = 4;
        local_278 = (nk_rp_rect *)&local_238[0].w;
        local_260 = 0;
        local_360 = 4;
        local_280 = (nk_rp_rect *)&local_238[0].w;
        uVar46 = 0;
        pnVar48 = local_440;
        local_3a0 = iVar71;
        local_328 = lVar28;
        do {
          pvVar52 = alloc[9].ptr;
          local_318 = pnVar48;
          local_310 = uVar46;
          nk_tt_PackSetOversampling
                    ((nk_tt_pack_context *)local_320,(uint)pnVar48->oversample_h,
                     (uint)pnVar48->oversample_v);
          local_308 = (long)*(int *)((long)pvVar52 + uVar46 * 0x48 + 0x40);
          local_394 = alloc[6].id;
          local_398 = *(undefined4 *)((long)alloc + 0x34);
          if (0 < local_308) {
            local_3b8 = (nk_tt_fontinfo *)((long)pvVar52 + uVar46 * 0x48);
            puVar77 = local_3b8[1].data;
            local_368._0_4_ = local_3b8[1].fontstart;
            local_368._4_4_ = local_3b8[1].numGlyphs;
            lVar67 = 0;
            lVar28 = 0;
            local_2f0 = puVar77;
            do {
              uVar80 = 0x80000000;
              uVar79 = 0x80000000;
              uVar83 = 0x80000000;
              fVar86 = *(float *)(local_368 + lVar67 * 0x28);
              if (fVar86 <= 0.0) {
                fVar86 = -fVar86;
                uVar59 = (uint)(ushort)(*(ushort *)(local_3b8->data + (long)local_3b8->head + 0x12)
                                        << 8 | *(ushort *)
                                                (local_3b8->data + (long)local_3b8->head + 0x12) >>
                                               8);
              }
              else {
                puVar9 = local_3b8->data;
                lVar54 = (long)local_3b8->hhea;
                uVar59 = ((int)(short)((ushort)puVar9[lVar54 + 4] << 8) | (uint)puVar9[lVar54 + 5])
                         - ((int)(short)((ushort)puVar9[lVar54 + 6] << 8) | (uint)puVar9[lVar54 + 7]
                           );
                uVar83 = 0;
                uVar79 = 0;
                uVar80 = 0;
              }
              fVar86 = fVar86 / (float)(int)uVar59;
              lVar54 = local_368 + lVar67 * 0x28;
              bVar3 = *(byte *)(lVar54 + 0x20);
              fVar84 = (float)bVar3;
              alloc[6].id = (uint)bVar3;
              local_3f0 = 0.0;
              local_3f4 = 0.0;
              if (bVar3 != 0) {
                local_3f4 = (float)(int)(1 - (uint)bVar3) / (fVar84 + fVar84);
              }
              bVar3 = *(byte *)(lVar54 + 0x21);
              *(uint *)((long)alloc + 0x34) = (uint)bVar3;
              fVar85 = (float)bVar3;
              if (bVar3 != 0) {
                local_3f0 = (float)(int)(1 - (uint)bVar3) / (fVar85 + fVar85);
              }
              local_300 = lVar67;
              if (0 < *(int *)(lVar54 + 0x10)) {
                local_38c = 1.0 / fVar84;
                local_390 = 1.0 / fVar85;
                lVar28 = (long)(int)lVar28;
                lVar67 = 0;
                local_3d8 = CONCAT44(uVar83,fVar86);
                uStack_3d0 = uVar79;
                uStack_3cc = uVar80;
                local_2e0 = lVar54;
                do {
                  pnVar72 = local_3b8;
                  if (*(int *)(puVar77 + lVar28 * 0x10 + 0xc) != 0) {
                    if (*(int *)(lVar54 + 4) == 0) {
                      iVar71 = *(int *)(*(long *)(lVar54 + 8) + lVar67 * 4);
                    }
                    else {
                      iVar71 = *(int *)(lVar54 + 4) + (int)lVar67;
                    }
                    puVar77 = puVar77 + lVar28 * 0x10;
                    local_298 = (short *)(lVar67 * 0x1c + *(long *)(lVar54 + 0x18));
                    local_290 = lVar67;
                    local_288 = lVar28;
                    iVar26 = nk_tt_FindGlyphIndex(local_3b8,iVar71);
                    iVar71 = *(int *)((long)alloc + 0x2c);
                    uVar56 = *(short *)(puVar77 + 8) + (short)iVar71;
                    *(ushort *)(puVar77 + 8) = uVar56;
                    uVar43 = *(short *)(puVar77 + 10) + (short)iVar71;
                    *(ushort *)(puVar77 + 10) = uVar43;
                    iVar58 = *(int *)(puVar77 + 4);
                    *(short *)(puVar77 + 4) = (short)(iVar58 - iVar71);
                    uVar42 = *(ushort *)(puVar77 + 6);
                    *(short *)(puVar77 + 6) = (short)((uint)uVar42 - iVar71);
                    puVar9 = pnVar72->data;
                    uVar44 = *(ushort *)(puVar9 + (long)pnVar72->hhea + 0x22) << 8 |
                             *(ushort *)(puVar9 + (long)pnVar72->hhea + 0x22) >> 8;
                    iVar19 = pnVar72->hmtx;
                    lVar28 = (ulong)uVar44 * 4 + (long)iVar19 + -4;
                    lVar67 = (ulong)uVar44 * 4 + (long)iVar19 + -3;
                    if (iVar26 < (int)(uint)uVar44) {
                      lVar28 = (long)(iVar26 * 4) + (long)iVar19;
                      lVar67 = (long)(iVar26 * 4) + 1 + (long)iVar19;
                    }
                    local_380 = (uint)puVar9[lVar28];
                    local_384 = (uint)puVar9[lVar67];
                    uVar59 = alloc[6].id;
                    uVar45 = *(uint *)((long)alloc + 0x34);
                    fVar85 = (float)uVar59 * (float)local_3d8;
                    fVar81 = (float)uVar45 * (float)local_3d8;
                    fVar84 = (float)local_3d8;
                    local_408 = puVar77;
                    nk_tt_GetGlyphBitmapBoxSubpixel
                              (pnVar72,iVar26,fVar85,fVar81,(float)local_3d8,fVar86,&local_378,
                               &local_37c,&local_23c,&local_240);
                    local_348 = (ulong)uVar56 + (long)alloc[7].ptr;
                    local_3ec = alloc[5].id;
                    uVar59 = (iVar58 - iVar71 & 0xffffU) - uVar59;
                    uVar46 = (ulong)uVar59;
                    uVar70 = nk_tt_GetGlyphShape(pnVar72,(nk_allocator *)alloc,iVar26,
                                                 (nk_tt_vertex **)&local_3e0);
                    pvVar52 = (void *)(ulong)uVar70;
                    nk_tt_GetGlyphBitmapBoxSubpixel
                              (pnVar72,iVar26,fVar85,fVar81,fVar84,fVar86,&local_41c,&local_374,
                               (int *)0x0,(int *)0x0);
                    iVar58 = local_374;
                    uVar59 = uVar59 + 1;
                    local_418 = uVar46;
                    if (uVar59 != 0) {
                      uVar45 = ((uint)uVar42 - iVar71 & 0xffff) - uVar45;
                      if (uVar45 + 1 != 0) {
                        lVar28 = CONCAT44(local_3e0._4_4_,(int)local_3e0);
                        local_3c8._0_4_ = local_41c;
                        local_238[0]._0_8_ = local_238[0]._0_8_ & 0xffffffff00000000;
                        if ((int)uVar70 < 1) {
                          uVar46 = 0;
                        }
                        else {
                          lVar67 = 0;
                          uVar46 = 0;
                          do {
                            uVar46 = (ulong)((int)uVar46 +
                                            (uint)(*(char *)(lVar28 + 8 + lVar67) == '\x01'));
                            lVar67 = lVar67 + 10;
                          } while ((long)pvVar52 * 10 != lVar67);
                        }
                        if ((int)uVar46 == 0) {
                          points = (nk_tt__point *)0x0;
                          pvVar33 = pvVar52;
                        }
                        else {
                          pvVar33 = (*alloc[1])(*alloc,(void *)0x0,(long)(int)uVar46 << 2);
                          if (pvVar33 == (void *)0x0) {
LAB_001226c0:
                            points = (nk_tt__point *)0x0;
                            uVar46 = 0;
                          }
                          else {
                            fVar86 = fVar81;
                            if (fVar85 <= fVar81) {
                              fVar86 = fVar85;
                            }
                            uVar34 = 0;
                            iVar71 = 0;
                            points = (nk_tt__point *)0x0;
                            local_428 = uVar46;
                            do {
                              local_460._8_8_ = uVar34;
                              if ((int)uVar34 == 0) {
LAB_001224ef:
                                local_238[0]._0_8_ = local_238[0]._0_8_ & 0xffffffff00000000;
                                if ((int)uVar70 < 1) {
                                  lVar67 = -1;
                                }
                                else {
                                  uVar57 = 0xffffffff;
                                  fVar82 = 0.0;
                                  lVar67 = 0;
                                  fVar84 = 0.0;
                                  do {
                                    cVar4 = *(char *)(lVar28 + 8 + lVar67);
                                    if (cVar4 == '\x03') {
                                      nk_tt__tesselate_curve
                                                (points,&local_238[0].id,fVar84,fVar82,
                                                 (float)(int)*(short *)(lVar28 + 4 + lVar67),
                                                 (float)(int)*(short *)(lVar28 + 6 + lVar67),
                                                 (float)(int)*(short *)(lVar28 + lVar67),
                                                 (float)(int)*(short *)(lVar28 + 2 + lVar67),
                                                 (0.35 / fVar86) * (0.35 / fVar86),0);
                                      fVar84 = (float)(int)*(short *)(lVar28 + lVar67);
                                      fVar82 = (float)(int)*(short *)(lVar28 + 2 + lVar67);
                                      uVar46 = local_238[0]._0_8_;
                                    }
                                    else {
                                      if (cVar4 == '\x02') {
                                        sVar6 = *(short *)(lVar28 + lVar67);
                                        sVar7 = *(short *)(lVar28 + 2 + lVar67);
                                      }
                                      else {
                                        uVar46 = local_238[0]._0_8_;
                                        if (cVar4 != '\x01') goto LAB_0012262a;
                                        if (-1 < (int)uVar57) {
                                          *(int *)((long)pvVar33 + (ulong)uVar57 * 4) =
                                               local_238[0].id - iVar71;
                                        }
                                        uVar57 = uVar57 + 1;
                                        sVar6 = *(short *)(lVar28 + lVar67);
                                        sVar7 = *(short *)(lVar28 + 2 + lVar67);
                                        iVar71 = local_238[0].id;
                                      }
                                      uVar46 = CONCAT44(local_238[0]._4_4_,local_238[0].id + 1);
                                      fVar82 = (float)(int)sVar7;
                                      fVar84 = (float)(int)sVar6;
                                      if (points != (nk_tt__point *)0x0) {
                                        points[local_238[0].id].x = fVar84;
                                        points[local_238[0].id].y = fVar82;
                                      }
                                    }
LAB_0012262a:
                                    local_238[0]._0_8_ = uVar46;
                                    lVar67 = lVar67 + 10;
                                  } while ((long)pvVar52 * 10 != lVar67);
                                  lVar67 = (long)(int)uVar57;
                                }
                                *(int *)((long)pvVar33 + lVar67 * 4) = local_238[0].id - iVar71;
                                bVar13 = true;
                              }
                              else {
                                bVar13 = false;
                                points = (nk_tt__point *)
                                         (*(code *)alloc[1])(*alloc,(void *)0x0,
                                                             (long)local_238[0].id << 3);
                                if (points != (nk_tt__point *)0x0) goto LAB_001224ef;
                                points = (nk_tt__point *)0x0;
                              }
                              if (!bVar13) {
                                (*(code *)alloc[2])(*alloc,points);
                                (*(code *)alloc[2])(*alloc,pvVar33);
                                pvVar33 = (void *)0x0;
                                goto LAB_001226c0;
                              }
                              uVar34 = (ulong)(local_460.fx + 1);
                              uVar46 = local_428;
                            } while (local_460.fx == 0);
                          }
                        }
                        if (points != (nk_tt__point *)0x0) {
                          if ((int)uVar46 < 1) {
                            nVar55 = 0x14;
                          }
                          else {
                            uVar34 = 0;
                            lVar28 = 0;
                            do {
                              lVar28 = (long)(int)lVar28 +
                                       (long)*(int *)((long)pvVar33 + uVar34 * 4);
                              uVar34 = uVar34 + 1;
                            } while ((uVar46 & 0xffffffff) != uVar34);
                            nVar55 = lVar28 * 0x14 + 0x14;
                          }
                          local_3b0 = points;
                          p_00 = (nk_tt__edge *)(*(code *)alloc[1])(*alloc,(void *)0x0,nVar55);
                          local_400 = p_00;
                          if (p_00 != (nk_tt__edge *)0x0) {
                            if ((int)uVar46 < 1) {
                              uVar70 = 0;
                            }
                            else {
                              uVar34 = 0;
                              uVar70 = 0;
                              iVar71 = 0;
                              do {
                                iVar19 = *(int *)((long)pvVar33 + uVar34 * 4);
                                if (0 < iVar19) {
                                  uVar63 = (ulong)(iVar19 - 1);
                                  uVar62 = 0;
                                  do {
                                    iVar26 = (int)uVar63;
                                    fVar86 = local_3b0[(long)iVar71 + (long)iVar26].y;
                                    fVar84 = local_3b0[(long)iVar71 + uVar62].y;
                                    if ((fVar86 != fVar84) || (NAN(fVar86) || NAN(fVar84))) {
                                      iVar68 = (int)uVar62;
                                      iVar75 = iVar26;
                                      if (fVar86 <= fVar84) {
                                        iVar75 = iVar68;
                                        iVar68 = iVar26;
                                      }
                                      p_00[(int)uVar70].invert = (uint)(fVar84 < fVar86);
                                      p_00[(int)uVar70].x0 =
                                           local_3b0[(long)iVar71 + (long)iVar75].x * fVar85 + 0.0;
                                      p_00[(int)uVar70].y0 =
                                           local_3b0[(long)iVar71 + (long)iVar75].y * -fVar81 + 0.0;
                                      p_00[(int)uVar70].x1 =
                                           local_3b0[(long)iVar71 + (long)iVar68].x * fVar85 + 0.0;
                                      p_00[(int)uVar70].y1 =
                                           local_3b0[(long)iVar71 + (long)iVar68].y * -fVar81 + 0.0;
                                      uVar70 = uVar70 + 1;
                                    }
                                    uVar63 = uVar62 & 0xffffffff;
                                    uVar62 = uVar62 + 1;
                                  } while ((long)uVar62 < (long)*(int *)((long)pvVar33 + uVar34 * 4)
                                          );
                                }
                                iVar71 = iVar71 + iVar19;
                                uVar34 = uVar34 + 1;
                              } while (uVar34 != (uVar46 & 0xffffffff));
                            }
                            nk_tt__sort_edges_quicksort(p_00,uVar70);
                            pnVar35 = local_238;
                            if (1 < (int)uVar70) {
                              uVar46 = 1;
                              do {
                                fVar86 = p_00[uVar46].x0;
                                fVar84 = p_00[uVar46].y0;
                                iVar71 = p_00[uVar46].invert;
                                local_238[0]._8_4_ = iVar71;
                                local_238[0].id = (int)p_00[uVar46].x1;
                                local_238[0]._4_4_ = p_00[uVar46].y1;
                                uVar34 = uVar46 & 0xffffffff;
                                do {
                                  uVar57 = (uint)uVar34;
                                  if ((int)uVar57 < 1) break;
                                  fVar85 = p_00[uVar34 - 1].y0;
                                  if (fVar84 < fVar85) {
                                    pnVar14 = p_00 + uVar34;
                                    pnVar14->invert = pnVar14[-1].invert;
                                    fVar81 = pnVar14[-1].y0;
                                    fVar82 = pnVar14[-1].x1;
                                    fVar87 = pnVar14[-1].y1;
                                    pnVar14->x0 = pnVar14[-1].x0;
                                    pnVar14->y0 = fVar81;
                                    pnVar14->x1 = fVar82;
                                    pnVar14->y1 = fVar87;
                                    uVar34 = (ulong)(uVar57 - 1);
                                  }
                                  uVar57 = (uint)uVar34;
                                } while (fVar84 < fVar85);
                                if (uVar46 != uVar57) {
                                  p_00[(int)uVar57].x0 = fVar86;
                                  p_00[(int)uVar57].y0 = fVar84;
                                  p_00[(int)uVar57].x1 = (float)local_238[0].id;
                                  p_00[(int)uVar57].y1 = (float)local_238[0]._4_4_;
                                  p_00[(int)uVar57].invert = iVar71;
                                }
                                uVar46 = uVar46 + 1;
                              } while (uVar46 != uVar70);
                            }
                            local_460.next = (nk_tt__active_edge *)0x0;
                            nVar10 = *alloc;
                            local_340 = alloc[1];
                            local_2f8 = alloc[2];
                            if (0x40 < (int)uVar59) {
                              pnVar35 = (nk_rp_rect *)
                                        (*(code *)local_340)
                                                  (nVar10,(void *)0x0,(ulong)uVar59 * 8 + 4);
                            }
                            p_00[(int)uVar70].y0 = (float)(int)(uVar45 + 1 + iVar58) + 1.0;
                            local_338 = nVar10;
                            if (uVar45 < 0x7fffffff) {
                              local_348 = local_348 + (int)((uint)uVar43 * local_3ec);
                              local_268 = (long)(int)uVar59;
                              local_410 = &pnVar35->id + local_268;
                              local_2a0 = (ulong)((uint)pnVar35 & 3);
                              local_2b0 = 4 - local_2a0;
                              local_2b8 = (nk_rp_rect *)(local_2b0 + (long)pnVar35);
                              local_2a8 = (ulong)((uint)local_410 & 3);
                              local_3a8 = (nk_handle *)
                                          CONCAT44(local_3a8._4_4_,(float)(int)local_3c8._0_4_);
                              local_2c0 = 4 - local_2a8;
                              local_2c8 = (int *)((long)local_410 + local_2c0);
                              local_330 = (nk_rp_coord *)(local_410 + 1);
                              local_270 = local_268 * 4;
                              local_388 = (int)local_418 + 2;
                              local_350 = (long)local_388 * 4;
                              local_2d0 = local_270 - local_2b0;
                              fVar86 = (float)(int)uVar59;
                              local_2d8 = local_350 - local_2c0;
                              local_248 = 0;
                              local_438 = (undefined8 *)0x0;
                              pnVar40 = (nk_tt__active_edge *)0x0;
                              local_430 = (nk_handle *)((ulong)local_430 & 0xffffffff00000000);
                              local_250 = 0;
                              do {
                                fVar84 = (float)iVar58;
                                fVar85 = fVar84 + 1.0;
                                pnVar37 = pnVar35;
                                uVar46 = local_270;
                                if (local_270 < 0xc) {
LAB_00122b4e:
                                  memset(pnVar37,0,uVar46);
                                }
                                else {
                                  if (local_2a0 != 0) {
                                    memset(pnVar35,0,local_2b0);
                                    uVar46 = local_2d0;
                                    pnVar37 = local_2b8;
                                  }
                                  memset(pnVar37,0,uVar46 & 0xfffffffffffffffc);
                                  if ((uVar46 & 3) != 0) {
                                    pnVar37 = (nk_rp_rect *)
                                              ((long)&pnVar37->id + (uVar46 & 0xfffffffffffffffc));
                                    uVar46 = uVar46 & 3;
                                    goto LAB_00122b4e;
                                  }
                                }
                                if (local_350 < 0xc) {
                                  uVar34 = local_350;
                                  piVar65 = local_410;
                                  if (local_388 != 0) {
LAB_00122bde:
                                    memset(piVar65,0,uVar34);
                                  }
                                }
                                else {
                                  uVar46 = local_350;
                                  piVar65 = local_410;
                                  if (local_2a8 != 0) {
                                    memset(local_410,0,local_2c0);
                                    uVar46 = local_2d8;
                                    piVar65 = local_2c8;
                                  }
                                  memset(piVar65,0,uVar46 & 0xfffffffffffffffc);
                                  if ((uVar46 & 3) != 0) {
                                    uVar34 = uVar46 & 3;
                                    piVar65 = (int *)((long)piVar65 + (uVar46 & 0xfffffffffffffffc))
                                    ;
                                    goto LAB_00122bde;
                                  }
                                }
                                puVar61 = local_438;
                                if (local_460.next != (nk_tt__active_edge *)0x0) {
                                  pnVar36 = local_460.next;
                                  pnVar39 = &local_460;
                                  do {
                                    pnVar49 = pnVar36;
                                    if (pnVar36->ey <= fVar84) {
                                      pnVar39->next = pnVar36->next;
                                      if ((pnVar36->direction == 0.0) && (!NAN(pnVar36->direction)))
                                      {
                                        __assert_fail("z->direction",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                                                  ,0x23e9,
                                                  "void nk_tt__rasterize_sorted_edges(struct nk_tt__bitmap *, struct nk_tt__edge *, int, int, int, int, struct nk_allocator *)"
                                                  );
                                      }
                                      pnVar36->direction = 0.0;
                                      pnVar36->next = pnVar40;
                                      pnVar49 = pnVar39;
                                      pnVar40 = pnVar36;
                                    }
                                    pnVar36 = pnVar49->next;
                                    pnVar39 = pnVar49;
                                  } while (pnVar36 != (nk_tt__active_edge *)0x0);
                                }
                                fVar81 = p_00->y0;
                                pnVar36 = local_460.next;
                                while (fVar81 <= fVar85) {
                                  if ((fVar81 != p_00->y1) || (NAN(fVar81) || NAN(p_00->y1))) {
                                    if (pnVar40 == (nk_tt__active_edge *)0x0) {
                                      pnVar39 = pnVar40;
                                      if ((int)local_430 == 0) {
                                        puVar38 = (undefined8 *)
                                                  (*(code *)local_340)(local_338,(void *)0x0,0x6408)
                                        ;
                                        if (puVar38 == (undefined8 *)0x0) {
                                          pnVar49 = (nk_tt__active_edge *)0x0;
                                          goto LAB_00123356;
                                        }
                                        *puVar38 = puVar61;
                                        local_430 = (nk_handle *)CONCAT44(local_430._4_4_,800);
                                        puVar61 = puVar38;
                                      }
                                      lVar28 = (long)(int)local_430;
                                      local_430 = (nk_handle *)
                                                  CONCAT44(local_430._4_4_,(int)local_430 + -1);
                                      pnVar49 = (nk_tt__active_edge *)(puVar61 + lVar28 * 4 + -4);
                                    }
                                    else {
                                      pnVar39 = pnVar40->next;
                                      pnVar49 = pnVar40;
                                    }
LAB_00123356:
                                    pnVar40 = pnVar39;
                                    if (pnVar49 != (nk_tt__active_edge *)0x0) {
                                      fVar81 = p_00->x0;
                                      fVar82 = p_00->y0;
                                      fVar87 = p_00->y1;
                                      fVar88 = (p_00->x1 - fVar81) / (fVar87 - fVar82);
                                      pnVar49->fdx = fVar88;
                                      pnVar49->fdy = (float)(-(uint)(fVar88 != 0.0) &
                                                            (uint)(1.0 / fVar88));
                                      pnVar49->fx = ((fVar84 - fVar82) * fVar88 + fVar81) -
                                                    local_3a8._0_4_;
                                      pnVar49->direction =
                                           *(float *)(&DAT_00152198 + (ulong)(p_00->invert == 0) * 4
                                                     );
                                      pnVar49->sy = fVar82;
                                      pnVar49->ey = fVar87;
                                      pnVar49->next = (nk_tt__active_edge *)0x0;
                                      if (fVar87 < fVar84) {
                                        local_460.next = pnVar36;
                                        __assert_fail("z->ey >= scan_y_top",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                                                  ,0x23f6,
                                                  "void nk_tt__rasterize_sorted_edges(struct nk_tt__bitmap *, struct nk_tt__edge *, int, int, int, int, struct nk_allocator *)"
                                                  );
                                      }
                                      pnVar49->next = pnVar36;
                                      pnVar36 = pnVar49;
                                    }
                                  }
                                  pnVar14 = p_00 + 1;
                                  p_00 = p_00 + 1;
                                  fVar81 = pnVar14->y0;
                                }
                                local_438 = puVar61;
                                local_460.next = pnVar36;
                                uVar46 = local_250;
                                uVar34 = local_248;
                                for (; pnVar36 != (nk_tt__active_edge *)0x0; pnVar36 = pnVar36->next
                                    ) {
                                  fVar81 = pnVar36->ey;
                                  local_250 = uVar46;
                                  local_248 = uVar34;
                                  if (fVar81 < fVar84) {
                                    __assert_fail("e->ey >= y_top",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                                                  ,0x232b,
                                                  "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
                                                 );
                                  }
                                  fVar82 = pnVar36->fx;
                                  fVar87 = pnVar36->fdx;
                                  if ((fVar87 != 0.0) || (NAN(fVar87))) {
                                    fVar88 = pnVar36->sy;
                                    if (fVar85 < fVar88) {
                                      __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                                                  ,0x233d,
                                                  "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
                                                  );
                                    }
                                    fVar90 = fVar87 + fVar82;
                                    fVar89 = (float)(~-(uint)(fVar84 < fVar88) & (uint)fVar82 |
                                                    (uint)((fVar88 - fVar84) * fVar87 + fVar82) &
                                                    -(uint)(fVar84 < fVar88));
                                    if ((((fVar89 < 0.0) ||
                                         (fVar91 = (float)(~-(uint)(fVar81 < fVar85) & (uint)fVar90
                                                          | (uint)((fVar81 - fVar84) * fVar87 +
                                                                  fVar82) & -(uint)(fVar81 < fVar85)
                                                          ), fVar91 < 0.0)) || (fVar86 <= fVar89))
                                       || (fVar86 <= fVar91)) {
                                      if ((uint)local_418 < 0x7fffffff) {
                                        local_3c8 = ZEXT416((uint)fVar82);
                                        uVar46 = local_428 >> 0x20;
                                        local_428 = CONCAT44((int)uVar46,fVar87);
                                        uVar70 = 0;
                                        do {
                                          fVar81 = (float)(int)uVar70;
                                          uVar57 = uVar70 + 1;
                                          fVar89 = (float)(int)uVar57;
                                          fVar88 = (fVar81 - fVar82) / fVar87 + fVar84;
                                          fVar87 = ((fVar81 + 1.0) - fVar82) / fVar87 + fVar84;
                                          local_460.fx = fVar81;
                                          if ((fVar81 <= fVar82) || (fVar90 <= fVar89)) {
                                            if ((fVar81 <= fVar90) || (fVar82 <= fVar89)) {
                                              fVar91 = fVar84;
                                              if (((fVar81 <= fVar82) || (fVar90 <= fVar81)) &&
                                                 ((fVar81 <= fVar90 || (fVar82 <= fVar81)))) {
                                                fVar88 = fVar84;
                                                if (((fVar82 < fVar89) && (fVar89 < fVar90)) ||
                                                   ((fVar90 < fVar89 && (fVar89 < fVar82))))
                                                goto LAB_00122ed6;
                                                goto LAB_00122f8d;
                                              }
                                            }
                                            else {
                                              nk_tt__handle_clipped_edge
                                                        ((float *)pnVar35,uVar70,pnVar36,fVar82,
                                                         fVar84,fVar89,fVar87);
                                              fVar82 = fVar89;
                                              fVar91 = fVar87;
                                              fVar81 = local_460.fx;
                                            }
                                            nk_tt__handle_clipped_edge
                                                      ((float *)pnVar35,uVar70,pnVar36,fVar82,fVar91
                                                       ,fVar81,fVar88);
                                            fVar82 = local_460.fx;
                                          }
                                          else {
                                            nk_tt__handle_clipped_edge
                                                      ((float *)pnVar35,uVar70,pnVar36,fVar82,fVar84
                                                       ,fVar81,fVar88);
                                            fVar82 = local_460.fx;
LAB_00122ed6:
                                            nk_tt__handle_clipped_edge
                                                      ((float *)pnVar35,uVar70,pnVar36,fVar82,fVar88
                                                       ,fVar89,fVar87);
                                            fVar82 = fVar89;
                                            fVar88 = fVar87;
                                          }
LAB_00122f8d:
                                          nk_tt__handle_clipped_edge
                                                    ((float *)pnVar35,uVar70,pnVar36,fVar82,fVar88,
                                                     fVar90,fVar85);
                                          fVar87 = (float)local_428;
                                          fVar82 = (float)local_3c8._0_4_;
                                          uVar70 = uVar57;
                                        } while (uVar59 != uVar57);
                                      }
                                    }
                                    else {
                                      if (fVar88 <= fVar84) {
                                        fVar88 = fVar84;
                                      }
                                      uVar70 = (uint)fVar89;
                                      if (fVar85 <= fVar81) {
                                        fVar81 = fVar85;
                                      }
                                      if (uVar70 == (int)fVar91) {
                                        if (((int)uVar70 < 0) || ((int)uVar59 <= (int)uVar70)) {
                                          __assert_fail("x >= 0 && x < len",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                                                  ,0x235a,
                                                  "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
                                                  );
                                        }
                                        uVar46 = (ulong)uVar70;
                                        (&pnVar35->id)[uVar46] =
                                             (int)((((fVar91 - (float)(int)uVar70) +
                                                    (fVar89 - (float)(int)uVar70)) * -0.5 + 1.0) *
                                                   pnVar36->direction * (fVar81 - fVar88) +
                                                  (float)(&pnVar35->id)[uVar46]);
                                        fVar82 = (fVar81 - fVar88) * pnVar36->direction;
                                      }
                                      else {
                                        fVar87 = pnVar36->fdy;
                                        fVar92 = fVar91;
                                        if (fVar91 < fVar89) {
                                          fVar82 = fVar84 - fVar88;
                                          fVar88 = (fVar84 - fVar81) + fVar85;
                                          fVar87 = -fVar87;
                                          fVar81 = fVar82 + fVar85;
                                          fVar92 = fVar89;
                                          fVar82 = fVar90;
                                          fVar89 = fVar91;
                                        }
                                        iVar71 = (int)fVar92;
                                        fVar91 = (((float)(int)fVar89 + 1.0) - fVar82) * fVar87 +
                                                 fVar84;
                                        fVar82 = pnVar36->direction;
                                        fVar90 = (fVar91 - fVar88) * fVar82;
                                        lVar28 = (long)(int)fVar89;
                                        iVar26 = (int)fVar89 + 1;
                                        (&pnVar35->id)[lVar28] =
                                             (int)((((fVar89 - (float)(int)fVar89) + 1.0) * -0.5 +
                                                   1.0) * fVar90 + (float)(&pnVar35->id)[lVar28]);
                                        iVar19 = iVar71 - iVar26;
                                        if (iVar19 != 0 && iVar26 <= iVar71) {
                                          do {
                                            *(float *)(&pnVar35->w + lVar28 * 2) =
                                                 fVar87 * fVar82 * 0.5 + fVar90 +
                                                 *(float *)(&pnVar35->w + lVar28 * 2);
                                            fVar90 = fVar90 + fVar87 * fVar82;
                                            lVar28 = lVar28 + 1;
                                          } while (iVar71 + -1 != (int)lVar28);
                                        }
                                        uVar46 = (ulong)iVar71;
                                        (&pnVar35->id)[uVar46] =
                                             (int)((fVar81 - (fVar87 * (float)iVar19 + fVar91)) *
                                                   (((fVar92 - (float)iVar71) + 0.0) * -0.5 + 1.0) *
                                                   fVar82 + fVar90 + (float)(&pnVar35->id)[uVar46]);
                                        fVar82 = (fVar81 - fVar88) * fVar82;
                                      }
                                      *(float *)(local_330 + uVar46 * 2) =
                                           fVar82 + *(float *)(local_330 + uVar46 * 2);
                                    }
                                  }
                                  else if (fVar82 < fVar86) {
                                    if (0.0 <= fVar82) {
                                      local_3c8 = ZEXT416((uint)fVar82);
                                      nk_tt__handle_clipped_edge
                                                ((float *)pnVar35,(int)fVar82,pnVar36,fVar82,fVar84,
                                                 fVar82,fVar85);
                                      iVar71 = (int)fVar82 + 1;
                                      fVar82 = (float)local_3c8._0_4_;
                                    }
                                    else {
                                      iVar71 = 0;
                                    }
                                    nk_tt__handle_clipped_edge
                                              ((float *)local_410,iVar71,pnVar36,fVar82,fVar84,
                                               fVar82,fVar85);
                                  }
                                  uVar46 = local_250;
                                  uVar34 = local_248;
                                }
                                pnVar36 = local_460.next;
                                if ((uint)local_418 < 0x7fffffff) {
                                  fVar84 = 0.0;
                                  uVar62 = uVar34 & 0xffffffff;
                                  pnVar37 = pnVar35;
                                  lVar28 = local_268;
                                  do {
                                    fVar84 = fVar84 + (float)(&pnVar37->id)[local_268];
                                    fVar81 = (float)pnVar37->id + fVar84;
                                    fVar85 = -fVar81;
                                    if (-fVar81 <= fVar81) {
                                      fVar85 = fVar81;
                                    }
                                    iVar71 = (int)(fVar85 * 255.0 + 0.5);
                                    uVar60 = (undefined1)iVar71;
                                    if (0xfe < iVar71) {
                                      uVar60 = 0xff;
                                    }
                                    *(undefined1 *)(local_348 + (int)uVar62) = uVar60;
                                    uVar62 = (ulong)((int)uVar62 + 1);
                                    pnVar37 = (nk_rp_rect *)&pnVar37->w;
                                    lVar28 = lVar28 + -1;
                                  } while (lVar28 != 0);
                                }
                                for (; pnVar36 != (nk_tt__active_edge *)0x0; pnVar36 = pnVar36->next
                                    ) {
                                  pnVar36->fx = pnVar36->fdx + pnVar36->fx;
                                }
                                iVar58 = iVar58 + 1;
                                local_250 = (ulong)((uint)uVar46 + 1);
                                local_248 = (ulong)(uint)((int)uVar34 + local_3ec);
                                puVar61 = local_438;
                                pnVar14 = local_400;
                                nVar10 = local_338;
                                nVar15 = local_2f8;
                              } while ((uint)uVar46 != uVar45);
                            }
                            else {
                              puVar61 = (undefined8 *)0x0;
                              pnVar14 = local_400;
                              nVar15 = local_2f8;
                              uVar46 = local_250;
                              uVar34 = local_248;
                            }
                            while (local_248 = uVar34, local_250 = uVar46, nVar18 = local_2f8,
                                  nVar17 = local_338, local_400 = pnVar14, local_338 = nVar10,
                                  local_2f8 = nVar15, puVar61 != (undefined8 *)0x0) {
                              puVar38 = (undefined8 *)*puVar61;
                              (*(code *)nVar18)(nVar17,puVar61);
                              puVar61 = puVar38;
                              pnVar14 = local_400;
                              nVar10 = local_338;
                              nVar15 = local_2f8;
                              uVar46 = local_250;
                              uVar34 = local_248;
                              local_2f8 = nVar18;
                              local_338 = nVar17;
                            }
                            if (pnVar35 != local_238) {
                              (*(code *)alloc[2])(*alloc,pnVar35);
                            }
                            (*(code *)alloc[2])(*alloc,pnVar14);
                          }
                          (*(code *)alloc[2])(*alloc,pvVar33);
                          (*(code *)alloc[2])(*alloc,local_3b0);
                        }
                      }
                    }
                    (*(code *)alloc[2])(*alloc,(void *)CONCAT44(local_3e0._4_4_,(int)local_3e0));
                    uVar59 = alloc[6].id;
                    uVar46 = (ulong)(int)uVar59;
                    if (1 < uVar46) {
                      local_460.fx = (float)(uint)*(ushort *)(local_408 + 6);
                      if (*(ushort *)(local_408 + 6) != 0) {
                        iVar71 = alloc[5].id;
                        uVar42 = *(ushort *)(local_408 + 4);
                        uVar45 = (uint)uVar42;
                        lVar28 = (long)alloc[7].ptr +
                                 (ulong)*(ushort *)(local_408 + 10) * (long)iVar71 +
                                 (ulong)*(ushort *)(local_408 + 8);
                        uVar34 = uVar46 - local_358;
                        fVar86 = 0.0;
                        do {
                          if (uVar59 < 0xc) {
                            pnVar35 = local_238;
                            uVar63 = uVar46;
LAB_001235cd:
                            memset(pnVar35,0,uVar63);
                          }
                          else {
                            uVar62 = uVar46;
                            pnVar35 = local_238;
                            if (local_258 != 0) {
                              memset(local_238,0,local_358);
                              uVar62 = uVar34;
                              pnVar35 = local_278;
                            }
                            memset(pnVar35,0,uVar62 & 0xfffffffffffffffc);
                            uVar63 = uVar62 & 3;
                            if (uVar63 != 0) {
                              pnVar35 = (nk_rp_rect *)
                                        ((long)&pnVar35->id + (uVar62 & 0xfffffffffffffffc));
                              goto LAB_001235cd;
                            }
                          }
                          if (uVar59 - 2 < 4) {
                            pvVar52 = (void *)(*(code *)(&DAT_00152250 +
                                                        *(int *)(&DAT_00152250 +
                                                                (ulong)(uVar59 - 2) * 4)))();
                            return pvVar52;
                          }
                          if ((int)(uint)uVar42 < (int)uVar59) {
                            uVar62 = 0;
                            uVar70 = 0;
                          }
                          else {
                            uVar62 = 0;
                            uVar70 = 0;
                            do {
                              bVar3 = *(byte *)(lVar28 + uVar62);
                              bVar5 = *(byte *)((long)&local_238[0].id + (ulong)((uint)uVar62 & 7));
                              *(byte *)((long)&local_238[0].id + (ulong)(uVar59 + (uint)uVar62 & 7))
                                   = bVar3;
                              uVar70 = uVar70 + ((uint)bVar3 - (uint)bVar5);
                              *(char *)(lVar28 + uVar62) = (char)(uVar70 / uVar59);
                              uVar62 = uVar62 + 1;
                            } while ((uVar45 - uVar59) + 1 != uVar62);
                          }
                          if ((int)uVar62 < (int)uVar45) {
                            uVar62 = uVar62 & 0xffffffff;
                            do {
                              if (*(char *)(lVar28 + uVar62) != '\0') {
                                __assert_fail("pixels[i] == 0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                                              ,0x25c3,
                                              "void nk_tt__h_prefilter(unsigned char *, int, int, int, int)"
                                             );
                              }
                              uVar70 = uVar70 - *(byte *)((long)&local_238[0].id +
                                                         (ulong)((uint)uVar62 & 7));
                              *(char *)(lVar28 + uVar62) = (char)(uVar70 / uVar59);
                              uVar62 = uVar62 + 1;
                            } while ((int)uVar62 < (int)uVar45);
                          }
                          lVar28 = lVar28 + iVar71;
                          fVar86 = (float)((int)fVar86 + 1);
                        } while (fVar86 != local_460.fx);
                      }
                    }
                    uVar59 = *(uint *)((long)alloc + 0x34);
                    uVar46 = (ulong)(int)uVar59;
                    fVar86 = (float)local_3d8;
                    if ((1 < uVar46) && (uVar42 = *(ushort *)(local_408 + 4), uVar42 != 0)) {
                      lVar28 = (long)alloc[5].id;
                      uVar70 = (uint)*(ushort *)(local_408 + 6);
                      pbVar69 = (byte *)((long)alloc[7].ptr +
                                        (ulong)*(ushort *)(local_408 + 10) * lVar28 +
                                        (ulong)*(ushort *)(local_408 + 8));
                      uVar34 = uVar46 - local_360;
                      uVar62 = (ulong)((uVar70 - uVar59) + 1);
                      uVar45 = 0;
                      do {
                        local_460.fx = (float)uVar45;
                        if (uVar59 < 0xc) {
                          pnVar35 = local_238;
                          uVar73 = uVar46;
LAB_001238c7:
                          memset(pnVar35,0,uVar73);
                        }
                        else {
                          uVar63 = uVar46;
                          pnVar35 = local_238;
                          if (local_260 != 0) {
                            memset(local_238,0,local_360);
                            uVar63 = uVar34;
                            pnVar35 = local_280;
                          }
                          memset(pnVar35,0,uVar63 & 0xfffffffffffffffc);
                          uVar73 = uVar63 & 3;
                          if (uVar73 != 0) {
                            pnVar35 = (nk_rp_rect *)
                                      ((long)&pnVar35->id + (uVar63 & 0xfffffffffffffffc));
                            goto LAB_001238c7;
                          }
                        }
                        switch(uVar59) {
                        case 2:
                          if ((int)uVar70 < (int)uVar59) {
LAB_00123a49:
                            uVar63 = 0;
                            uVar45 = 0;
                          }
                          else {
                            uVar63 = 0;
                            uVar45 = 0;
                            pbVar66 = pbVar69;
                            do {
                              bVar3 = *pbVar66;
                              bVar5 = *(byte *)((long)&local_238[0].id + (ulong)((uint)uVar63 & 7));
                              *(byte *)((long)&local_238[0].id + (ulong)((uint)uVar63 + 2 & 7)) =
                                   bVar3;
                              uVar45 = uVar45 + ((uint)bVar3 - (uint)bVar5);
                              *pbVar66 = (byte)(uVar45 >> 1);
                              uVar63 = uVar63 + 1;
                              pbVar66 = pbVar66 + lVar28;
                            } while (uVar62 != uVar63);
                          }
                          break;
                        case 3:
                          if ((int)uVar70 < (int)uVar59) goto LAB_00123a49;
                          uVar63 = 0;
                          uVar45 = 0;
                          pbVar66 = pbVar69;
                          do {
                            bVar3 = *pbVar66;
                            bVar5 = *(byte *)((long)&local_238[0].id + (ulong)((uint)uVar63 & 7));
                            *(byte *)((long)&local_238[0].id + (ulong)((uint)uVar63 + 3 & 7)) =
                                 bVar3;
                            uVar45 = uVar45 + ((uint)bVar3 - (uint)bVar5);
                            *pbVar66 = (byte)(uVar45 / 3);
                            uVar63 = uVar63 + 1;
                            pbVar66 = pbVar66 + lVar28;
                          } while (uVar62 != uVar63);
                          break;
                        case 4:
                          if ((int)uVar70 < (int)uVar59) goto LAB_00123a49;
                          uVar63 = 0;
                          uVar45 = 0;
                          pbVar66 = pbVar69;
                          do {
                            bVar3 = *pbVar66;
                            uVar73 = (ulong)((uint)uVar63 & 7);
                            bVar5 = *(byte *)((long)&local_238[0].id + uVar73);
                            *(byte *)((long)&local_238[0].id + (uVar73 ^ 4)) = bVar3;
                            uVar45 = uVar45 + ((uint)bVar3 - (uint)bVar5);
                            *pbVar66 = (byte)(uVar45 >> 2);
                            uVar63 = uVar63 + 1;
                            pbVar66 = pbVar66 + lVar28;
                          } while (uVar62 != uVar63);
                          break;
                        case 5:
                          if ((int)uVar70 < (int)uVar59) goto LAB_00123a49;
                          uVar63 = 0;
                          uVar45 = 0;
                          pbVar66 = pbVar69;
                          do {
                            bVar3 = *pbVar66;
                            bVar5 = *(byte *)((long)&local_238[0].id + (ulong)((uint)uVar63 & 7));
                            *(byte *)((long)&local_238[0].id + (ulong)((uint)uVar63 + 5 & 7)) =
                                 bVar3;
                            uVar45 = uVar45 + ((uint)bVar3 - (uint)bVar5);
                            *pbVar66 = (byte)(uVar45 / 5);
                            uVar63 = uVar63 + 1;
                            pbVar66 = pbVar66 + lVar28;
                          } while (uVar62 != uVar63);
                          break;
                        default:
                          if ((int)uVar70 < (int)uVar59) goto LAB_00123a49;
                          uVar63 = 0;
                          uVar45 = 0;
                          pbVar66 = pbVar69;
                          do {
                            bVar3 = *pbVar66;
                            bVar5 = *(byte *)((long)&local_238[0].id + (ulong)((uint)uVar63 & 7));
                            *(byte *)((long)&local_238[0].id + (ulong)(uVar59 + (uint)uVar63 & 7)) =
                                 bVar3;
                            uVar45 = uVar45 + ((uint)bVar3 - (uint)bVar5);
                            *pbVar66 = (byte)(uVar45 / uVar59);
                            uVar63 = uVar63 + 1;
                            pbVar66 = pbVar66 + lVar28;
                          } while (uVar62 != uVar63);
                        }
                        iVar71 = (int)uVar63;
                        iVar58 = uVar70 - iVar71;
                        if (iVar58 != 0 && iVar71 <= (int)uVar70) {
                          lVar67 = (long)iVar71;
                          pbVar66 = pbVar69 + lVar28 * lVar67;
                          do {
                            if (*pbVar66 != 0) {
                              __assert_fail("pixels[i*stride_in_bytes] == 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                                            ,0x2603,
                                            "void nk_tt__v_prefilter(unsigned char *, int, int, int, int)"
                                           );
                            }
                            uVar45 = uVar45 - *(byte *)((long)&local_238[0].id +
                                                       (ulong)((uint)lVar67 & 7));
                            *pbVar66 = (byte)(uVar45 / uVar59);
                            lVar67 = lVar67 + 1;
                            pbVar66 = pbVar66 + lVar28;
                            iVar58 = iVar58 + -1;
                          } while (iVar58 != 0);
                        }
                        pbVar69 = pbVar69 + 1;
                        uVar45 = (int)local_460.fx + 1;
                        fVar86 = (float)local_3d8;
                      } while (uVar45 != uVar42);
                    }
                    uVar83 = *(undefined4 *)(local_408 + 8);
                    *local_298 = (short)uVar83;
                    sVar6 = *(short *)(local_408 + 10);
                    local_298[1] = sVar6;
                    uVar42 = *(ushort *)(local_408 + 4);
                    local_298[2] = (short)uVar83 + uVar42;
                    uVar43 = *(ushort *)(local_408 + 6);
                    local_298[3] = sVar6 + uVar43;
                    *(float *)(local_298 + 8) =
                         (float)(int)(short)((short)(local_380 << 8) + (short)local_384) * fVar86;
                    *(float *)(local_298 + 4) = (float)local_378 * local_38c + local_3f4;
                    *(float *)(local_298 + 6) = (float)local_37c * local_390 + local_3f0;
                    *(float *)(local_298 + 10) =
                         ((float)uVar42 + (float)local_378) * local_38c + local_3f4;
                    fVar86 = ((float)uVar43 + (float)local_37c) * local_390 + local_3f0;
                    *(float *)(local_298 + 0xc) = fVar86;
                    lVar67 = local_290;
                    lVar54 = local_2e0;
                    puVar77 = local_2f0;
                    lVar28 = local_288;
                  }
                  lVar28 = lVar28 + 1;
                  lVar67 = lVar67 + 1;
                } while (lVar67 < *(int *)(lVar54 + 0x10));
              }
              lVar67 = local_300 + 1;
            } while (lVar67 != local_308);
          }
          alloc[6].id = local_394;
          *(undefined4 *)((long)alloc + 0x34) = local_398;
          uVar46 = local_310 + 1;
        } while ((uVar46 < local_3e8) &&
                (pnVar48 = local_318->next, pnVar48 != (nk_font_config *)0x0));
        (*(code *)alloc[2])(*alloc,alloc[8].ptr);
        (*(code *)alloc[2])(*alloc,alloc[3].ptr);
        if (0 < (int)local_3e8) {
          pvVar52 = alloc[9].ptr;
          fVar86 = (float)local_3a0;
          fVar84 = (float)(int)local_328;
          uVar46 = 0;
          nVar50 = 0;
          do {
            plVar1 = (long *)((long)pvVar52 + uVar46 * 0x48);
            pnVar11 = local_440->font;
            if (local_440->merge_mode == '\0') {
              fVar85 = local_440->size;
              lVar28 = *plVar1;
              lVar67 = (long)*(int *)((long)plVar1 + 0x1c);
              uVar45 = (int)(short)((ushort)*(byte *)(lVar28 + 4 + lVar67) << 8) |
                       (uint)*(byte *)(lVar28 + 5 + lVar67);
              uVar59 = (int)(short)((ushort)*(byte *)(lVar28 + 6 + lVar67) << 8) |
                       (uint)*(byte *)(lVar28 + 7 + lVar67);
              pnVar11->ranges = local_440->range;
              pnVar11->height = fVar85;
              fVar85 = fVar85 / (float)(int)(uVar45 - uVar59);
              pnVar11->ascent = (float)(int)uVar45 * fVar85;
              pnVar11->descent = (float)(int)uVar59 * fVar85;
              pnVar11->glyph_offset = nVar50;
            }
            uVar59 = *(uint *)(plVar1 + 8);
            if ((ulong)uVar59 == 0) {
              nVar64 = 0;
            }
            else {
              lVar28 = plVar1[7];
              uVar34 = 0;
              nVar64 = 0;
              do {
                lVar67 = (long)*(int *)(lVar28 + 0x10 + uVar34 * 0x28);
                if (0 < lVar67) {
                  lVar54 = lVar28 + uVar34 * 0x28;
                  puVar74 = *(ushort **)(lVar54 + 0x18);
                  lVar78 = 0;
                  do {
                    if ((((*puVar74 != 0) || (puVar74[2] != 0)) || (puVar74[1] != 0)) ||
                       (puVar74[3] != 0)) {
                      fVar85 = *(float *)(puVar74 + 4);
                      fVar81 = *(float *)(puVar74 + 6);
                      fVar82 = *(float *)(puVar74 + 10);
                      fVar87 = *(float *)(puVar74 + 0xc);
                      fVar89 = (float)*puVar74 * (1.0 / fVar84);
                      fVar90 = (float)puVar74[1] * (1.0 / fVar86);
                      fVar91 = (float)puVar74[2] * (1.0 / fVar84);
                      fVar88 = (float)puVar74[3] * (1.0 / fVar86);
                      uVar45 = pnVar11->glyph_offset + nVar64;
                      local_2e8[uVar45].codepoint = *(int *)(lVar54 + 4) + (int)lVar78;
                      local_2e8[uVar45].x0 = fVar85 + 0.0;
                      local_2e8[uVar45].y0 = fVar81 + 0.0;
                      local_2e8[uVar45].x1 = fVar82 + 0.0;
                      local_2e8[uVar45].y1 = fVar87 + 0.0;
                      fVar92 = pnVar11->ascent + 0.5;
                      fVar81 = fVar81 + 0.0 + fVar92;
                      local_2e8[uVar45].y0 = fVar81;
                      fVar92 = fVar92 + fVar87 + 0.0;
                      local_2e8[uVar45].y1 = fVar92;
                      local_2e8[uVar45].w = ((fVar82 + 0.0) - (fVar85 + 0.0)) + 0.5;
                      local_2e8[uVar45].h = fVar92 - fVar81;
                      if (local_440->coord_type == NK_COORD_PIXEL) {
                        local_2e8[uVar45].u0 = fVar89 * fVar84;
                        local_2e8[uVar45].v0 = fVar90 * fVar86;
                        local_2e8[uVar45].u1 = fVar91 * fVar84;
                        fVar88 = fVar88 * fVar86;
                      }
                      else {
                        local_2e8[uVar45].u0 = fVar89;
                        local_2e8[uVar45].v0 = fVar90;
                        local_2e8[uVar45].u1 = fVar91;
                      }
                      local_2e8[uVar45].v1 = fVar88;
                      fVar85 = *(float *)(puVar74 + 8) + (local_440->spacing).x;
                      local_2e8[uVar45].xadvance = fVar85;
                      if (local_440->pixel_snap != '\0') {
                        local_2e8[uVar45].xadvance = (float)(int)(fVar85 + 0.5);
                      }
                      nVar64 = nVar64 + 1;
                    }
                    lVar78 = lVar78 + 1;
                    puVar74 = puVar74 + 0xe;
                  } while (lVar67 != lVar78);
                }
                uVar34 = uVar34 + 1;
              } while (uVar34 != uVar59);
            }
            pnVar11->glyph_count = nVar64;
            uVar46 = uVar46 + 1;
            if (local_3e8 <= uVar46) break;
            nVar50 = nVar50 + nVar64;
            local_440 = local_440->next;
          } while (local_440 != (nk_font_config *)0x0);
        }
      }
    }
    pvVar52 = atlas->pixel;
    if (pvVar52 == (void *)0x0) {
      __assert_fail("img_memory",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x2828,
                    "void nk_font_bake_custom_data(void *, int, int, struct nk_recti, const char *, int, int, char, char)"
                   );
    }
    iVar71 = *width;
    if (iVar71 == 0) {
      __assert_fail("img_width",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x2829,
                    "void nk_font_bake_custom_data(void *, int, int, struct nk_recti, const char *, int, int, char, char)"
                   );
    }
    if (*height == 0) {
      __assert_fail("img_height",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x282a,
                    "void nk_font_bake_custom_data(void *, int, int, struct nk_recti, const char *, int, int, char, char)"
                   );
    }
    iVar58._0_2_ = (atlas->custom).x;
    iVar58._2_2_ = (atlas->custom).y;
    iVar58 = (iVar58 >> 0x10) * iVar71 + (int)(short)(undefined2)iVar58;
    iVar19 = 0;
    lVar28 = 0;
    do {
      lVar67 = 0;
      do {
        cVar4 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...XXX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..XX.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.XX..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XXX...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -                 X..X          -  X...X  -         X...X         -  X..X           X..X  -                  XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           ------------        -    X    -           X           -X..............." /* TRUNCATED STRING LITERAL */
                [(int)lVar28 + lVar67];
        lVar54 = (long)(iVar58 + (int)lVar67);
        *(char *)((long)pvVar52 + lVar54) = -(cVar4 == '.');
        *(char *)((long)pvVar52 + lVar54 + 0x5b) = -(cVar4 == 'X');
        lVar67 = lVar67 + 1;
      } while (lVar67 != 0x5a);
      iVar19 = iVar19 + 1;
      lVar28 = (long)(int)lVar28 + 0x5a;
      iVar58 = iVar58 + iVar71;
    } while (iVar19 != 0x1b);
    if (local_39c == NK_FONT_ATLAS_RGBA32) {
      pvVar52 = (*(atlas->temporary).alloc)
                          ((atlas->temporary).userdata,(void *)0x0,(long)(*width * *height * 4));
      if (pvVar52 == (void *)0x0) {
        __assert_fail("img_rgba",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x2b59,
                      "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                     );
      }
      pvVar33 = atlas->pixel;
      if (pvVar33 == (void *)0x0) {
        __assert_fail("in_memory",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x2844,"void nk_font_bake_convert(void *, int, int, const void *)");
      }
      if (*width == 0) {
        __assert_fail("img_width",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x2845,"void nk_font_bake_convert(void *, int, int, const void *)");
      }
      if (*height == 0) {
        __assert_fail("img_height",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x2846,"void nk_font_bake_convert(void *, int, int, const void *)");
      }
      iVar71 = *height * *width;
      if (0 < iVar71) {
        iVar71 = iVar71 + 1;
        lVar28 = 0;
        do {
          *(uint *)((long)pvVar52 + lVar28 * 4) =
               (uint)*(byte *)((long)pvVar33 + lVar28) << 0x18 | 0xffffff;
          lVar28 = lVar28 + 1;
          iVar71 = iVar71 + -1;
        } while (1 < iVar71);
      }
      (*(atlas->temporary).free)((atlas->temporary).userdata,pvVar33);
      atlas->pixel = pvVar52;
    }
    atlas->tex_width = *width;
    atlas->tex_height = *height;
    for (pnVar27 = atlas->fonts; pnVar27 != (nk_font *)0x0; pnVar27 = pnVar27->next) {
      pnVar29 = atlas->glyphs;
      if (pnVar29 == (nk_font_glyph *)0x0) {
        __assert_fail("glyphs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x28b4,
                      "void nk_font_init(struct nk_font *, float, nk_rune, struct nk_font_glyph *, const struct nk_baked_font *, nk_handle)"
                     );
      }
      pnVar48 = pnVar27->config;
      pnVar11 = pnVar48->font;
      if (pnVar11 == (nk_baked_font *)0x0) {
        __assert_fail("baked_font",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x28b5,
                      "void nk_font_init(struct nk_font *, float, nk_rune, struct nk_font_glyph *, const struct nk_baked_font *, nk_handle)"
                     );
      }
      fVar86 = pnVar48->size;
      nVar50 = pnVar48->fallback_glyph;
      fVar84 = pnVar11->ascent;
      fVar85 = pnVar11->descent;
      nVar64 = pnVar11->glyph_offset;
      nVar16 = pnVar11->glyph_count;
      uVar83 = *(undefined4 *)&pnVar11->field_0x14;
      pnVar8 = pnVar11->ranges;
      (pnVar27->info).height = pnVar11->height;
      (pnVar27->info).ascent = fVar84;
      (pnVar27->info).descent = fVar85;
      (pnVar27->info).glyph_offset = nVar64;
      (pnVar27->info).glyph_count = nVar16;
      *(undefined4 *)&(pnVar27->info).field_0x14 = uVar83;
      (pnVar27->info).ranges = pnVar8;
      pnVar27->scale = fVar86 / (pnVar27->info).height;
      pnVar27->glyphs = pnVar29 + pnVar11->glyph_offset;
      (pnVar27->texture).ptr = (void *)0x0;
      pnVar27->fallback_codepoint = nVar50;
      pnVar29 = nk_font_find_glyph(pnVar27,nVar50);
      pnVar27->fallback = pnVar29;
      (pnVar27->handle).height = (pnVar27->info).height * pnVar27->scale;
      (pnVar27->handle).width = nk_font_text_width;
      (pnVar27->handle).userdata.ptr = pnVar27;
      (pnVar27->handle).query = nk_font_query_font_glyph;
      (pnVar27->handle).texture = pnVar27->texture;
    }
    sVar6 = (atlas->custom).x;
    sVar7 = (atlas->custom).y;
    pnVar41 = nk_font_atlas_bake::nk_cursor_data[0] + 2;
    lVar28 = 0x68;
    do {
      *(short *)((long)(&atlas->cursors[0].img + -4) + lVar28) = (short)*width;
      *(short *)((long)atlas->cursors[0].img.region + lVar28 + -0x6a) = (short)*height;
      *(short *)((long)atlas->cursors[0].img.region + lVar28 + -0x68) =
           (short)(int)(pnVar41[-2].x + (float)(int)sVar6);
      *(short *)((long)atlas->cursors[0].img.region + lVar28 + -0x66) =
           (short)(int)(pnVar41[-2].y + (float)(int)sVar7);
      *(short *)((long)atlas->cursors[0].img.region + lVar28 + -100) = (short)(int)pnVar41[-1].x;
      *(short *)((long)atlas->cursors[0].img.region + lVar28 + -0x62) = (short)(int)pnVar41[-1].y;
      nVar12 = *pnVar41;
      pnVar2 = (nk_vec2 *)((long)(atlas->cursors + -2) + lVar28);
      *pnVar2 = pnVar41[-1];
      pnVar2[1] = nVar12;
      pnVar41 = pnVar41 + 3;
      lVar28 = lVar28 + 0x28;
    } while (lVar28 != 0x180);
    (*(atlas->temporary).free)((atlas->temporary).userdata,local_370);
    pvVar52 = atlas->pixel;
  }
  return pvVar52;
}

Assistant:

NK_API const void*
nk_font_atlas_bake(struct nk_font_atlas *atlas, int *width, int *height,
    enum nk_font_atlas_format fmt)
{
    int i = 0;
    void *tmp = 0;
    nk_size tmp_size, img_size;
    struct nk_font *font_iter;
    struct nk_font_baker *baker;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    NK_ASSERT(width);
    NK_ASSERT(height);
    if (!atlas || !width || !height ||
        !atlas->temporary.alloc || !atlas->temporary.free ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

#ifdef NK_INCLUDE_DEFAULT_FONT
    /* no font added so just use default font */
    if (!atlas->font_num)
        atlas->default_font = nk_font_atlas_add_default(atlas, 13.0f, 0);
#endif
    NK_ASSERT(atlas->font_num);
    if (!atlas->font_num) return 0;

    /* allocate temporary baker memory required for the baking process */
    nk_font_baker_memory(&tmp_size, &atlas->glyph_count, atlas->config, atlas->font_num);
    tmp = atlas->temporary.alloc(atlas->temporary.userdata,0, tmp_size);
    NK_ASSERT(tmp);
    if (!tmp) goto failed;

    /* allocate glyph memory for all fonts */
    baker = nk_font_baker(tmp, atlas->glyph_count, atlas->font_num, &atlas->temporary);
    atlas->glyphs = (struct nk_font_glyph*)atlas->permanent.alloc(
        atlas->permanent.userdata,0, sizeof(struct nk_font_glyph)*(nk_size)atlas->glyph_count);
    NK_ASSERT(atlas->glyphs);
    if (!atlas->glyphs)
        goto failed;

    /* pack all glyphs into a tight fit space */
    atlas->custom.w = (NK_CURSOR_DATA_W*2)+1;
    atlas->custom.h = NK_CURSOR_DATA_H + 1;
    if (!nk_font_bake_pack(baker, &img_size, width, height, &atlas->custom,
        atlas->config, atlas->font_num, &atlas->temporary))
        goto failed;

    /* allocate memory for the baked image font atlas */
    atlas->pixel = atlas->temporary.alloc(atlas->temporary.userdata,0, img_size);
    NK_ASSERT(atlas->pixel);
    if (!atlas->pixel)
        goto failed;

    /* bake glyphs and custom white pixel into image */
    nk_font_bake(baker, atlas->pixel, *width, *height,
        atlas->glyphs, atlas->glyph_count, atlas->config, atlas->font_num);
    nk_font_bake_custom_data(atlas->pixel, *width, *height, atlas->custom,
            nk_custom_cursor_data, NK_CURSOR_DATA_W, NK_CURSOR_DATA_H, '.', 'X');

    if (fmt == NK_FONT_ATLAS_RGBA32) {
        /* convert alpha8 image into rgba32 image */
        void *img_rgba = atlas->temporary.alloc(atlas->temporary.userdata,0,
                            (nk_size)(*width * *height * 4));
        NK_ASSERT(img_rgba);
        if (!img_rgba) goto failed;
        nk_font_bake_convert(img_rgba, *width, *height, atlas->pixel);
        atlas->temporary.free(atlas->temporary.userdata, atlas->pixel);
        atlas->pixel = img_rgba;
    }
    atlas->tex_width = *width;
    atlas->tex_height = *height;

    /* initialize each font */
    for (font_iter = atlas->fonts; font_iter; font_iter = font_iter->next) {
        struct nk_font *font = font_iter;
        struct nk_font_config *config = font->config;
        nk_font_init(font, config->size, config->fallback_glyph, atlas->glyphs,
            config->font, nk_handle_ptr(0));
    }

    /* initialize each cursor */
    {NK_STORAGE const struct nk_vec2 nk_cursor_data[NK_CURSOR_COUNT][3] = {
        /* Pos ----- Size ------- Offset --*/
        {{ 0, 3},   {12,19},    { 0, 0}},
        {{13, 0},   { 7,16},    { 4, 8}},
        {{31, 0},   {23,23},    {11,11}},
        {{21, 0},   { 9, 23},   { 5,11}},
        {{55,18},   {23, 9},    {11, 5}},
        {{73, 0},   {17,17},    { 9, 9}},
        {{55, 0},   {17,17},    { 9, 9}}
    };
    for (i = 0; i < NK_CURSOR_COUNT; ++i) {
        struct nk_cursor *cursor = &atlas->cursors[i];
        cursor->img.w = (unsigned short)*width;
        cursor->img.h = (unsigned short)*height;
        cursor->img.region[0] = (unsigned short)(atlas->custom.x + nk_cursor_data[i][0].x);
        cursor->img.region[1] = (unsigned short)(atlas->custom.y + nk_cursor_data[i][0].y);
        cursor->img.region[2] = (unsigned short)nk_cursor_data[i][1].x;
        cursor->img.region[3] = (unsigned short)nk_cursor_data[i][1].y;
        cursor->size = nk_cursor_data[i][1];
        cursor->offset = nk_cursor_data[i][2];
    }}
    /* free temporary memory */
    atlas->temporary.free(atlas->temporary.userdata, tmp);
    return atlas->pixel;

failed:
    /* error so cleanup all memory */
    if (tmp) atlas->temporary.free(atlas->temporary.userdata, tmp);
    if (atlas->glyphs) {
        atlas->permanent.free(atlas->permanent.userdata, atlas->glyphs);
        atlas->glyphs = 0;
    }
    if (atlas->pixel) {
        atlas->temporary.free(atlas->temporary.userdata, atlas->pixel);
        atlas->pixel = 0;
    }
    return 0;
}